

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

Real __thiscall
amrex::MLNodeLinOp::xdoty(MLNodeLinOp *this,int amrlev,int mglev,MultiFab *x,MultiFab *y,bool local)

{
  Real RVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  MultiFab *this_00;
  BoxArray *info;
  MultiFab *src;
  FabArrayBase *in_RCX;
  int in_EDX;
  long in_RDI;
  FabArrayBase *in_R8;
  byte in_R9B;
  Real result;
  int i;
  MultiFab tmp;
  int nghost;
  int ncomp;
  MultiFab *mask;
  size_type in_stack_fffffffffffffd98;
  undefined8 *puVar5;
  MPI_Comm comm;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda0;
  undefined8 *puVar6;
  undefined4 in_stack_fffffffffffffdd0;
  int iVar7;
  BoxArray *bxs;
  undefined4 in_stack_fffffffffffffdf0;
  int local_200;
  undefined8 local_1f0;
  BoxArray local_1e8 [2];
  undefined1 in_stack_ffffffffffffff23;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  MultiFab *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  MultiFab *in_stack_ffffffffffffff40;
  undefined1 local_14 [12];
  undefined1 *local_8;
  
  local_8 = local_14;
  iVar2 = in_EDX + 1;
  piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                     (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (iVar2 == *piVar4) {
    this_00 = (MultiFab *)(in_RDI + 0x248);
  }
  else {
    this_00 = (MultiFab *)(in_RDI + 0x3c8);
  }
  iVar3 = FabArrayBase::nComp(in_R8);
  info = FabArrayBase::boxArray(in_RCX);
  src = (MultiFab *)FabArrayBase::DistributionMap(in_RCX);
  local_1e8[0].m_bat.m_op._12_8_ = 0;
  local_1e8[0].m_bat.m_op._20_8_ = 0;
  local_1e8[0].m_bat._0_8_ = 0;
  local_1e8[0].m_bat.m_op._4_8_ = 0;
  local_1e8[0].m_bat.m_op._28_8_ = 0;
  bxs = local_1e8;
  iVar7 = iVar3;
  MFInfo::MFInfo((MFInfo *)0x1682a3a);
  local_1f0 = 0;
  puVar5 = &local_1f0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffda0);
  puVar6 = puVar5;
  MultiFab::MultiFab(this_00,bxs,(DistributionMapping *)CONCAT44(iVar7,in_stack_fffffffffffffdd0),
                     (int)((ulong)src >> 0x20),(int)src,(MFInfo *)info,
                     (FabFactory<amrex::FArrayBox> *)CONCAT44(iVar2,in_stack_fffffffffffffdf0));
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x1682a8c);
  MFInfo::~MFInfo((MFInfo *)0x1682a99);
  MultiFab::Copy((MultiFab *)CONCAT44(iVar7,in_stack_fffffffffffffdd0),src,
                 (int)((ulong)info >> 0x20),(int)info,(int)((ulong)puVar6 >> 0x20),(int)puVar6);
  for (local_200 = 0; local_200 < iVar3; local_200 = local_200 + 1) {
    MultiFab::Multiply((MultiFab *)CONCAT44(iVar7,in_stack_fffffffffffffdd0),src,
                       (int)((ulong)info >> 0x20),(int)info,(int)((ulong)puVar6 >> 0x20),(int)puVar6
                      );
  }
  comm = (MPI_Comm)((ulong)puVar5 >> 0x20);
  RVar1 = MultiFab::Dot(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                        in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                        (bool)in_stack_ffffffffffffff23);
  if ((in_R9B & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<double>((double *)in_stack_fffffffffffffda0,comm);
  }
  MultiFab::~MultiFab((MultiFab *)0x1682bd5);
  return RVar1;
}

Assistant:

Real
MLNodeLinOp::xdoty (int amrlev, int mglev, const MultiFab& x, const MultiFab& y, bool local) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0);
    AMREX_ASSERT(mglev+1==m_num_mg_levels[0] || mglev==0);
    const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
    const int ncomp = y.nComp();
    const int nghost = 0;
    MultiFab tmp(x.boxArray(), x.DistributionMap(), ncomp, 0);
    MultiFab::Copy(tmp, x, 0, 0, ncomp, nghost);
    for (int i = 0; i < ncomp; i++) {
        MultiFab::Multiply(tmp, mask, 0, i, 1, nghost);
    }
    Real result = MultiFab::Dot(tmp,0,y,0,ncomp,nghost,true);
    if (!local) {
        ParallelAllReduce::Sum(result, ParallelContext::CommunicatorSub());
    }
    return result;
}